

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

void __thiscall io::detail::AsynchronousReader::~AsynchronousReader(AsynchronousReader *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> guard;
  
  if ((this->byte_source)._M_t.
      super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
      super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
      super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl != (ByteSourceBase *)0x0) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->lock);
    this->termination_requested = true;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->read_requested_condition);
  std::condition_variable::~condition_variable(&this->read_finished_condition);
  std::__exception_ptr::exception_ptr::~exception_ptr(&this->read_error);
  std::thread::~thread(&this->worker);
  std::unique_ptr<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>::~unique_ptr
            (&this->byte_source);
  return;
}

Assistant:

~AsynchronousReader(){
                                if(byte_source != nullptr){
                                        {
                                                std::unique_lock<std::mutex>guard(lock);
                                                termination_requested = true;
                                        }
                                        read_requested_condition.notify_one();
                                        worker.join();
                                }
                        }